

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O2

int main(void)

{
  mg_server *server;
  char *pcVar1;
  
  server = mg_create_server((void *)0x0,ev_handler);
  mg_set_option(server,"document_root",".");
  mg_set_option(server,"listening_port","8080");
  pcVar1 = mg_get_option(server,"listening_port");
  printf("Starting on port %s\n",pcVar1);
  do {
    mg_poll_server(server,1000);
  } while( true );
}

Assistant:

int main(void){
	struct mg_server *server;

	// Criar e configurar o servidor
	server = mg_create_server(NULL, ev_handler);
	mg_set_option(server, "document_root", ".");
	mg_set_option(server, "listening_port", "8080");


	// Ctrl+C para encerrar o programa
	printf("Starting on port %s\n", mg_get_option(server, "listening_port"));
	for (;;) {
		mg_poll_server(server, 1000);
	}

	// Zera e Libera o servidor
	mg_destroy_server(&server);

    return 0;
}